

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SearchableObjectHolder.hpp
# Opt level: O2

void __thiscall
gmlc::concurrency::SearchableObjectHolder<helics::Core,_helics::CoreType>::~SearchableObjectHolder
          (SearchableObjectHolder<helics::Core,_helics::CoreType> *this)

{
  uint uVar1;
  unique_lock<std::mutex> lock;
  duration<long,_std::ratio<1L,_1000L>_> local_38;
  unique_lock<std::mutex> local_30;
  
  if (((((this->trippedDetect).lineDetector.
         super___shared_ptr<const_std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_M_base).
       _M_i & 1U) == 0) {
    std::unique_lock<std::mutex>::unique_lock(&local_30,&this->mapLock);
    uVar1 = 0;
    do {
      if ((this->objectMap)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) break;
      std::unique_lock<std::mutex>::unlock(&local_30);
      if ((uVar1 & 1) == 0) {
        sched_yield();
      }
      else {
        local_38.__r = 100;
        std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_38);
      }
      std::unique_lock<std::mutex>::lock(&local_30);
      uVar1 = uVar1 + 1;
    } while (uVar1 != 7);
    std::unique_lock<std::mutex>::~unique_lock(&local_30);
  }
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &(this->trippedDetect).lineDetector.
              super___shared_ptr<const_std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<helics::CoreType,_std::allocator<helics::CoreType>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<helics::CoreType,_std::allocator<helics::CoreType>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<helics::CoreType,_std::allocator<helics::CoreType>_>_>_>_>
  ::~_Rb_tree(&(this->typeMap)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Core>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Core>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Core>_>_>_>
  ::~_Rb_tree(&(this->objectMap)._M_t);
  return;
}

Assistant:

~SearchableObjectHolder()
    {
#ifdef ENABLE_TRIPWIRE
        // this is a short circuit used to detect shutdown
        if (trippedDetect.isTripped()) {
            return;
        }
#endif
        std::unique_lock<std::mutex> lock(mapLock);
        int cntr = 0;
        while (!objectMap.empty()) {
            ++cntr;
            lock.unlock();
            // don't leave things locked while sleeping or yielding
            if (cntr % 2 != 0) {
                std::this_thread::yield();
            } else {
                std::this_thread::sleep_for(std::chrono::milliseconds(100));
            }

            lock.lock();
            if (cntr > 6) {
                break;
            }
        }
    }